

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

refs_t * refs_load_fai(refs_t *r_orig,char *fn,int is_err)

{
  ref_entry *__ptr;
  FILE *__stream;
  int iVar1;
  khint_t kVar2;
  size_t sVar3;
  refs_t *r;
  char *pcVar4;
  BGZF *pBVar5;
  ref_entry *__ptr_00;
  ushort **ppuVar6;
  longlong lVar7;
  long lVar8;
  ref_entry **pprVar9;
  ulong uVar10;
  char *pcVar11;
  char cVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  int n;
  stat sb;
  char fai_fn [4096];
  char line [8192];
  char *local_30e0;
  int local_30d4;
  FILE *local_30d0;
  stat local_30c8;
  char local_3038 [4096];
  char local_2038;
  char local_2037 [8199];
  
  sVar3 = strlen(fn);
  r = r_orig;
  if ((r_orig == (refs_t *)0x0) && (r = refs_create(), r == (refs_t *)0x0)) {
    r = (refs_t *)0x0;
    goto LAB_00125c8b;
  }
  iVar1 = stat(fn,&local_30c8);
  if (iVar1 == 0) {
    if ((r->fp == (BGZF *)0x0) || (iVar1 = bgzf_close(r->fp), iVar1 == 0)) {
      r->fp = (BGZF *)0x0;
      pcVar11 = fn;
      pcVar4 = string_dup(r->pool,fn);
      r->fn = pcVar4;
      if (pcVar4 != (char *)0x0) {
        if (4 < sVar3) {
          pcVar11 = ".fai";
          iVar1 = strcmp(fn + (sVar3 - 4),".fai");
          if (iVar1 == 0) {
            pcVar4[sVar3 - 4] = '\0';
            pcVar4 = r->fn;
          }
        }
        pBVar5 = bgzf_open_ref(pcVar4,pcVar11);
        r->fp = pBVar5;
        if (pBVar5 != (BGZF *)0x0) {
          sprintf(local_3038,"%.*s.fai",0xffb,r->fn);
          iVar1 = stat(local_3038,&local_30c8);
          if ((iVar1 == 0) && (local_30d0 = fopen(local_3038,"r"), local_30d0 != (FILE *)0x0)) {
            pcVar4 = fgets(&local_2038,0x2000,local_30d0);
            if (pcVar4 == (char *)0x0) {
              return r;
            }
            uVar13 = 0;
            uVar14 = 0;
            do {
              __ptr_00 = (ref_entry *)malloc(0x38);
              cVar12 = local_2038;
              if (__ptr_00 == (ref_entry *)0x0) {
                return (refs_t *)0x0;
              }
              pcVar4 = &local_2038;
              if (local_2038 != '\0') {
                ppuVar6 = __ctype_b_loc();
                do {
                  if ((*(byte *)((long)*ppuVar6 + (long)cVar12 * 2 + 1) & 0x20) != 0) break;
                  cVar12 = pcVar4[1];
                  pcVar4 = pcVar4 + 1;
                } while (cVar12 != '\0');
              }
              local_30e0 = pcVar4 + 1;
              *pcVar4 = '\0';
              pcVar11 = string_dup(r->pool,&local_2038);
              pcVar4 = local_30e0;
              __ptr_00->name = pcVar11;
              cVar12 = *local_30e0;
              if (cVar12 != '\0') {
                ppuVar6 = __ctype_b_loc();
                local_30e0 = pcVar4;
                do {
                  if ((*(byte *)((long)*ppuVar6 + (long)cVar12 * 2 + 1) & 0x20) == 0) break;
                  cVar12 = local_30e0[1];
                  local_30e0 = local_30e0 + 1;
                } while (cVar12 != '\0');
              }
              lVar7 = strtoll(local_30e0,&local_30e0,10);
              pcVar4 = local_30e0;
              __ptr_00->length = lVar7;
              cVar12 = *local_30e0;
              if (cVar12 != '\0') {
                ppuVar6 = __ctype_b_loc();
                local_30e0 = pcVar4;
                do {
                  if ((*(byte *)((long)*ppuVar6 + (long)cVar12 * 2 + 1) & 0x20) == 0) break;
                  cVar12 = local_30e0[1];
                  local_30e0 = local_30e0 + 1;
                } while (cVar12 != '\0');
              }
              lVar7 = strtoll(local_30e0,&local_30e0,10);
              pcVar4 = local_30e0;
              __ptr_00->offset = lVar7;
              cVar12 = *local_30e0;
              if (cVar12 != '\0') {
                ppuVar6 = __ctype_b_loc();
                local_30e0 = pcVar4;
                do {
                  if ((*(byte *)((long)*ppuVar6 + (long)cVar12 * 2 + 1) & 0x20) == 0) break;
                  cVar12 = local_30e0[1];
                  local_30e0 = local_30e0 + 1;
                } while (cVar12 != '\0');
              }
              lVar8 = strtol(local_30e0,&local_30e0,10);
              pcVar4 = local_30e0;
              __ptr_00->bases_per_line = (int)lVar8;
              cVar12 = *local_30e0;
              if (cVar12 != '\0') {
                ppuVar6 = __ctype_b_loc();
                local_30e0 = pcVar4;
                do {
                  if ((*(byte *)((long)*ppuVar6 + (long)cVar12 * 2 + 1) & 0x20) == 0) break;
                  cVar12 = local_30e0[1];
                  local_30e0 = local_30e0 + 1;
                } while (cVar12 != '\0');
              }
              lVar8 = strtol(local_30e0,&local_30e0,10);
              __ptr_00->line_length = (int)lVar8;
              __ptr_00->fn = r->fn;
              __ptr_00->count = 0;
              __ptr_00->seq = (char *)0x0;
              kVar2 = kh_put_refs(r->h_meta,__ptr_00->name,&local_30d4);
              if (local_30d4 == 0) {
                pprVar9 = r->h_meta->vals;
                __ptr = pprVar9[kVar2];
                if (__ptr != (ref_entry *)0x0) {
                  if ((__ptr->count != 0) || (__ptr->length != 0)) {
                    free(__ptr_00);
                    goto LAB_00125f07;
                  }
                  free(__ptr);
                  pprVar9 = r->h_meta->vals;
                }
                pprVar9[kVar2] = __ptr_00;
              }
              else {
                if (local_30d4 == -1) {
                  free(__ptr_00);
                  return (refs_t *)0x0;
                }
                r->h_meta->vals[kVar2] = __ptr_00;
              }
LAB_00125f07:
              __stream = local_30d0;
              pprVar9 = r->ref_id;
              if ((long)(int)uVar14 <= (long)uVar13) {
                bVar15 = uVar14 == 0;
                uVar14 = uVar14 * 2;
                if (bVar15) {
                  uVar14 = 0x10;
                }
                pprVar9 = (ref_entry **)realloc(pprVar9,(long)(int)uVar14 * 8);
                r->ref_id = pprVar9;
                if ((long)uVar13 < (long)(int)uVar14) {
                  uVar10 = uVar13;
                  do {
                    r->ref_id[uVar10] = (ref_entry *)0x0;
                    uVar10 = uVar10 + 1;
                  } while (uVar14 != uVar10);
                  pprVar9 = r->ref_id;
                }
              }
              pprVar9[uVar13] = __ptr_00;
              uVar13 = uVar13 + 1;
              r->nref = (int)uVar13;
              pcVar4 = fgets(&local_2038,0x2000,__stream);
              if (pcVar4 == (char *)0x0) {
                return r;
              }
            } while( true );
          }
          if (is_err != 0) {
            fn = local_3038;
            goto LAB_00125cad;
          }
        }
      }
    }
  }
  else if (is_err != 0) {
LAB_00125cad:
    perror(fn);
  }
  if (r_orig != (refs_t *)0x0) {
    return (refs_t *)0x0;
  }
LAB_00125c8b:
  refs_free(r);
  return (refs_t *)0x0;
}

Assistant:

static refs_t *refs_load_fai(refs_t *r_orig, char *fn, int is_err) {
    struct stat sb;
    FILE *fp = NULL;
    char fai_fn[PATH_MAX];
    char line[8192];
    refs_t *r = r_orig;
    size_t fn_l = strlen(fn);
    int id = 0, id_alloc = 0;

    RP("refs_load_fai %s\n", fn);

    if (!r)
	if (!(r = refs_create()))
	    goto err;

    /* Open reference, for later use */
    if (stat(fn, &sb) != 0) {
	if (is_err)
	    perror(fn);
	goto err;
    }

    if (r->fp)
	if (bgzf_close(r->fp) != 0)
	    goto err;
    r->fp = NULL;

    if (!(r->fn = string_dup(r->pool, fn)))
	goto err;
	
    if (fn_l > 4 && strcmp(&fn[fn_l-4], ".fai") == 0)
	r->fn[fn_l-4] = 0;

    if (!(r->fp = bgzf_open_ref(r->fn, "r")))
	goto err;

    /* Parse .fai file and load meta-data */
    sprintf(fai_fn, "%.*s.fai", PATH_MAX-5, r->fn);

    if (stat(fai_fn, &sb) != 0) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    if (!(fp = fopen(fai_fn, "r"))) {
	if (is_err)
	    perror(fai_fn);
	goto err;
    }
    while (fgets(line, 8192, fp) != NULL) {
	ref_entry *e = malloc(sizeof(*e));
	char *cp;
	int n;
	khint_t k;

	if (!e)
	    return NULL;

	// id
	for (cp = line; *cp && !isspace(*cp); cp++)
	    ;
	*cp++ = 0;
	e->name = string_dup(r->pool, line);
	
	// length
	while (*cp && isspace(*cp))
	    cp++;
	e->length = strtoll(cp, &cp, 10);

	// offset
	while (*cp && isspace(*cp))
	    cp++;
	e->offset = strtoll(cp, &cp, 10);

	// bases per line
	while (*cp && isspace(*cp))
	    cp++;
	e->bases_per_line = strtol(cp, &cp, 10);

	// line length
	while (*cp && isspace(*cp))
	    cp++;
	e->line_length = strtol(cp, &cp, 10);

	// filename
	e->fn = r->fn;

	e->count = 0;
	e->seq = NULL;

	k = kh_put(refs, r->h_meta, e->name, &n);
	if (-1 == n)  {
	    free(e);
	    return NULL;
	}

	if (n) {
	    kh_val(r->h_meta, k) = e;
	} else {
	    ref_entry *re = kh_val(r->h_meta, k);
	    if (re && (re->count != 0 || re->length != 0)) {
		/* Keep old */
		free(e);
	    } else {
		/* Replace old */
		if (re)
		    free(re);
		kh_val(r->h_meta, k) = e;
	    }
	}

	if (id >= id_alloc) {
	    int x;

	    id_alloc = id_alloc ?id_alloc*2 : 16;
	    r->ref_id = realloc(r->ref_id, id_alloc * sizeof(*r->ref_id));

	    for (x = id; x < id_alloc; x++)
		r->ref_id[x] = NULL;
	}
	r->ref_id[id] = e;
	r->nref = ++id;
    }

    return r;

 err:
    if (fp)
	fclose(fp);

    if (!r_orig)
	refs_free(r);
    
    return NULL;
}